

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

int flss(UINT16 val)

{
  int bit;
  UINT16 val_local;
  undefined4 local_4;
  
  bit = 0x10;
  if (val == 0) {
    local_4 = 0;
  }
  else {
    val_local = val;
    if ((val & 0xff00) == 0) {
      bit = 8;
      val_local = val << 8;
    }
    if ((val_local & 0xf000) == 0) {
      bit = bit + -4;
      val_local = val_local << 4;
    }
    if ((val_local & 0xc000) == 0) {
      bit = bit + -2;
      val_local = val_local << 2;
    }
    if ((val_local & 0x8000) == 0) {
      bit = bit + -1;
    }
    local_4 = bit;
  }
  return local_4;
}

Assistant:

LOCAL(int)
flss(UINT16 val)
{
  int bit;

  bit = 16;

  if (!val)
    return 0;

  if (!(val & 0xff00)) {
    bit -= 8;
    val <<= 8;
  }
  if (!(val & 0xf000)) {
    bit -= 4;
    val <<= 4;
  }
  if (!(val & 0xc000)) {
    bit -= 2;
    val <<= 2;
  }
  if (!(val & 0x8000)) {
    bit -= 1;
    val <<= 1;
  }

  return bit;
}